

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int yaml_parser_register_anchor(yaml_parser_t *parser,int index,yaml_char_t *anchor)

{
  yaml_alias_data_t **top;
  yaml_mark_t *pyVar1;
  yaml_node_t *pyVar2;
  size_t sVar3;
  yaml_alias_data_t *pyVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  yaml_alias_data_t *pyVar11;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  
  iVar10 = 1;
  if (anchor != (yaml_char_t *)0x0) {
    pyVar2 = (parser->document->nodes).start;
    sVar3 = pyVar2[(long)index + -1].start_mark.column;
    pyVar1 = &pyVar2[(long)index + -1].start_mark;
    sVar6 = pyVar1->index;
    sVar7 = pyVar1->line;
    local_60 = (undefined4)sVar6;
    uStack_5c = (undefined4)(sVar6 >> 0x20);
    uStack_58 = (undefined4)sVar7;
    pyVar4 = (parser->aliases).top;
    for (pyVar11 = (parser->aliases).start; pyVar11 != pyVar4; pyVar11 = pyVar11 + 1) {
      iVar10 = strcmp((char *)pyVar11->anchor,(char *)anchor);
      if (iVar10 == 0) {
        yaml_free(anchor);
        sVar5 = (pyVar11->mark).column;
        sVar8 = (pyVar11->mark).index;
        sVar9 = (pyVar11->mark).line;
        parser->error = YAML_COMPOSER_ERROR;
        parser->context = "found duplicate anchor; first occurrence";
        (parser->context_mark).index = sVar8;
        (parser->context_mark).line = sVar9;
        (parser->context_mark).column = sVar5;
        parser->problem = "second occurrence";
        (parser->problem_mark).index = sVar6;
        (parser->problem_mark).line = sVar7;
        (parser->problem_mark).column = sVar3;
        goto LAB_0010bcf5;
      }
    }
    top = &(parser->aliases).top;
    if ((pyVar4 == (parser->aliases).end) &&
       (iVar10 = yaml_stack_extend(&(parser->aliases).start,top,&(parser->aliases).end), iVar10 == 0
       )) {
      parser->error = YAML_MEMORY_ERROR;
      yaml_free(anchor);
LAB_0010bcf5:
      iVar10 = 0;
    }
    else {
      pyVar11 = *top;
      *top = pyVar11 + 1;
      pyVar11->anchor = anchor;
      pyVar11->index = index;
      *(ulong *)&pyVar11->field_0xc = CONCAT44(local_60,uStack_64);
      *(ulong *)((long)&(pyVar11->mark).index + 4) = CONCAT44(uStack_58,uStack_5c);
      (pyVar11->mark).line = sVar7;
      (pyVar11->mark).column = sVar3;
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

static int
yaml_parser_register_anchor(yaml_parser_t *parser,
        int index, yaml_char_t *anchor)
{
    yaml_alias_data_t data;
    yaml_alias_data_t *alias_data;

    if (!anchor) return 1;

    data.anchor = anchor;
    data.index = index;
    data.mark = parser->document->nodes.start[index-1].start_mark;

    for (alias_data = parser->aliases.start;
            alias_data != parser->aliases.top; alias_data ++) {
        if (strcmp((char *)alias_data->anchor, (char *)anchor) == 0) {
            yaml_free(anchor);
            return yaml_parser_set_composer_error_context(parser,
                    "found duplicate anchor; first occurrence",
                    alias_data->mark, "second occurrence", data.mark);
        }
    }

    if (!PUSH(parser, parser->aliases, data)) {
        yaml_free(anchor);
        return 0;
    }

    return 1;
}